

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void generateSortTail(Parse *pParse,Select *p,SortCtx *pSort,int nColumn,SelectDest *pDest)

{
  byte bVar1;
  ushort uVar2;
  int p2;
  int iVar3;
  Vdbe *p_00;
  ExprList *pEVar4;
  int p2_00;
  byte bVar5;
  int p3;
  int iVar6;
  uint p2_01;
  char *pcVar7;
  Op *pOVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  anon_union_4_2_6146edf4_for_u *paVar12;
  int p2_02;
  int iVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  int local_94;
  int local_64;
  
  p_00 = pParse->pVdbe;
  p2 = pSort->labelDone;
  p2_02 = pParse->nLabel + -1;
  pParse->nLabel = p2_02;
  bVar1 = pDest->eDest;
  iVar10 = pDest->iSDParm;
  pEVar4 = p->pEList;
  iVar3 = pSort->nOBSat;
  iVar6 = pSort->pOrderBy->nExpr - iVar3;
  if (iVar6 == 1 || iVar3 == 0) {
    pcVar7 = "LAST TERM OF ";
    if (iVar3 == 0) {
      pcVar7 = "";
    }
    sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR %sORDER BY",pcVar7);
  }
  else {
    sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR LAST %d TERMS OF ORDER BY");
  }
  if (pSort->labelBkOut != 0) {
    sqlite3VdbeAddOp3(p_00,10,pSort->regReturn,pSort->labelBkOut,0);
    sqlite3VdbeAddOp3(p_00,9,0,p2,0);
    sqlite3VdbeResolveLabel(p_00,pSort->labelBkOut);
  }
  iVar3 = pSort->iECursor;
  if ((bVar1 == 9) || (bVar1 == 0xd)) {
LAB_00191891:
    p3 = pDest->iSdst;
    local_94 = 0;
  }
  else {
    if (bVar1 == 10) {
      if (p->iOffset != 0) {
        sqlite3VdbeAddOp3(p_00,0x4b,0,pDest->iSdst,0);
      }
      goto LAB_00191891;
    }
    if (pParse->nTempReg == '\0') {
      local_94 = pParse->nMem + 1;
      pParse->nMem = local_94;
    }
    else {
      bVar5 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar5;
      local_94 = pParse->aTempReg[bVar5];
    }
    if ((bVar1 & 0xfd) == 0xc) {
      if (pParse->nTempReg == '\0') {
        p3 = pParse->nMem + 1;
        pParse->nMem = p3;
      }
      else {
        bVar5 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar5;
        p3 = pParse->aTempReg[bVar5];
      }
      nColumn = 0;
    }
    else {
      p3 = sqlite3GetTempRange(pParse,nColumn);
    }
  }
  if ((pSort->sortFlags & 1) == 0) {
    local_64 = sqlite3VdbeAddOp3(p_00,0x23,iVar3,p2,0);
    if (0 < p->iOffset) {
      sqlite3VdbeAddOp3(p_00,0x32,p->iOffset,p2_02,1);
    }
    iVar13 = 1;
    iVar15 = iVar3;
    if (0 < p->iOffset) {
      sqlite3VdbeAddOp3(p_00,0x56,p->iLimit,-1,0);
    }
  }
  else {
    iVar15 = pParse->nTab;
    iVar13 = pParse->nMem + 1;
    pParse->nMem = iVar13;
    pParse->nTab = iVar15 + 1;
    if (pSort->labelBkOut == 0) {
      iVar14 = 0;
    }
    else {
      iVar14 = sqlite3VdbeAddOp3(p_00,0xf,0,0,0);
    }
    sqlite3VdbeAddOp3(p_00,0x79,iVar15,iVar13,iVar6 + nColumn + 1);
    if (iVar14 != 0) {
      if (p_00->db->mallocFailed == '\0') {
        pOVar8 = p_00->aOp + iVar14;
      }
      else {
        pOVar8 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar8->p2 = p_00->nOp;
    }
    local_64 = sqlite3VdbeAddOp3(p_00,0x22,iVar3,p2,0);
    sqlite3VdbeAddOp3(p_00,0x85,iVar3,iVar13,iVar15);
    iVar13 = 0;
  }
  iVar14 = iVar13 + iVar6 + -1;
  uVar11 = (ulong)(uint)nColumn;
  if (0 < nColumn) {
    lVar9 = 0;
    do {
      iVar14 = iVar14 + (uint)(*(short *)((long)&pEVar4->a[0].u + lVar9) == 0);
      lVar9 = lVar9 + 0x18;
    } while (uVar11 * 0x18 != lVar9);
  }
  if (0 < nColumn) {
    paVar12 = &pEVar4->a[uVar11 - 1].u;
    do {
      uVar2 = (paVar12->x).iOrderByCol;
      p2_00 = uVar2 - 1;
      if (uVar2 == 0) {
        p2_00 = iVar14;
      }
      iVar14 = iVar14 - (uint)(uVar2 == 0);
      sqlite3VdbeAddOp3(p_00,0x5e,iVar15,p2_00,p3 + -1 + (int)uVar11);
      paVar12 = paVar12 + -6;
      bVar16 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar16);
  }
  switch(bVar1) {
  case 9:
    iVar10 = pDest->iSdst;
    iVar6 = 0x54;
    p2_01 = nColumn;
    goto LAB_00191c32;
  case 10:
    break;
  case 0xb:
    pcVar7 = pDest->zAffSdst;
    iVar6 = sqlite3VdbeAddOp3(p_00,0x61,p3,nColumn,local_94);
    sqlite3VdbeChangeP4(p_00,iVar6,pcVar7,nColumn);
    sqlite3VdbeAddOp4Int(p_00,0x8a,iVar10,local_94,p3,nColumn);
    break;
  case 0xc:
  case 0xe:
    sqlite3VdbeAddOp3(p_00,0x5e,iVar15,iVar13 + iVar6,p3);
    sqlite3VdbeAddOp3(p_00,0x7f,iVar10,local_94,0);
    sqlite3VdbeAddOp3(p_00,0x80,iVar10,p3,local_94);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
    }
    break;
  default:
    iVar10 = pDest->iSDParm;
    iVar6 = 0xc;
    p2_01 = 0;
LAB_00191c32:
    sqlite3VdbeAddOp3(p_00,iVar6,iVar10,p2_01,0);
    break;
  case 0xf:
    iVar6 = pDest->iSDParm2;
    if (pParse->nTempReg == '\0') {
      iVar15 = pParse->nMem + 1;
      pParse->nMem = iVar15;
    }
    else {
      bVar5 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar5;
      iVar15 = pParse->aTempReg[bVar5];
    }
    sqlite3VdbeAddOp3(p_00,0x61,p3 - (iVar6 >> 0x1f),nColumn + (iVar6 >> 0x1f),iVar15);
    if (iVar6 < 0) {
      sqlite3VdbeAddOp3(p_00,0x80,iVar10,iVar15,p3);
    }
    else {
      sqlite3VdbeAddOp4Int(p_00,0x8a,iVar10,iVar15,p3,iVar6);
    }
  }
  if (local_94 != 0) {
    if ((bVar1 == 0xb) && (nColumn != 1)) {
      if (pParse->nRangeReg < nColumn) {
        pParse->nRangeReg = nColumn;
        pParse->iRangeReg = p3;
      }
    }
    else if (p3 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = p3;
      }
    }
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = local_94;
    }
  }
  sqlite3VdbeResolveLabel(p_00,p2_02);
  bVar16 = (pSort->sortFlags & 1) == 0;
  sqlite3VdbeAddOp3(p_00,bVar16 + 0x25 + (uint)bVar16,iVar3,local_64 + 1,0);
  if (pSort->regReturn != 0) {
    sqlite3VdbeAddOp3(p_00,0x43,pSort->regReturn,0,0);
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  return;
}

Assistant:

static void generateSortTail(
  Parse *pParse,    /* Parsing context */
  Select *p,        /* The SELECT statement */
  SortCtx *pSort,   /* Information on the ORDER BY clause */
  int nColumn,      /* Number of columns of data */
  SelectDest *pDest /* Write the sorted results here */
){
  Vdbe *v = pParse->pVdbe;                     /* The prepared statement */
  int addrBreak = pSort->labelDone;            /* Jump here to exit loop */
  int addrContinue = sqlite3VdbeMakeLabel(pParse);/* Jump here for next cycle */
  int addr;                       /* Top of output loop. Jump for Next. */
  int addrOnce = 0;
  int iTab;
  ExprList *pOrderBy = pSort->pOrderBy;
  int eDest = pDest->eDest;
  int iParm = pDest->iSDParm;
  int regRow;
  int regRowid;
  int iCol;
  int nKey;                       /* Number of key columns in sorter record */
  int iSortTab;                   /* Sorter cursor to read from */
  int i;
  int bSeq;                       /* True if sorter record includes seq. no. */
  int nRefKey = 0;
  struct ExprList_item *aOutEx = p->pEList->a;
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  int addrExplain;                /* Address of OP_Explain instruction */
#endif

  nKey = pOrderBy->nExpr - pSort->nOBSat;
  if( pSort->nOBSat==0 || nKey==1 ){
    ExplainQueryPlan2(addrExplain, (pParse, 0,
      "USE TEMP B-TREE FOR %sORDER BY", pSort->nOBSat?"LAST TERM OF ":""
    ));
  }else{
    ExplainQueryPlan2(addrExplain, (pParse, 0,
      "USE TEMP B-TREE FOR LAST %d TERMS OF ORDER BY", nKey
    ));
  }
  sqlite3VdbeScanStatusRange(v, addrExplain,pSort->addrPush,pSort->addrPushEnd);
  sqlite3VdbeScanStatusCounters(v, addrExplain, addrExplain, pSort->addrPush);


  assert( addrBreak<0 );
  if( pSort->labelBkOut ){
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeGoto(v, addrBreak);
    sqlite3VdbeResolveLabel(v, pSort->labelBkOut);
  }

#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  /* Open any cursors needed for sorter-reference expressions */
  for(i=0; i<pSort->nDefer; i++){
    Table *pTab = pSort->aDefer[i].pTab;
    int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
    sqlite3OpenTable(pParse, pSort->aDefer[i].iCsr, iDb, pTab, OP_OpenRead);
    nRefKey = MAX(nRefKey, pSort->aDefer[i].nKey);
  }
#endif

  iTab = pSort->iECursor;
  if( eDest==SRT_Output || eDest==SRT_Coroutine || eDest==SRT_Mem ){
    if( eDest==SRT_Mem && p->iOffset ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pDest->iSdst);
    }
    regRowid = 0;
    regRow = pDest->iSdst;
  }else{
    regRowid = sqlite3GetTempReg(pParse);
    if( eDest==SRT_EphemTab || eDest==SRT_Table ){
      regRow = sqlite3GetTempReg(pParse);
      nColumn = 0;
    }else{
      regRow = sqlite3GetTempRange(pParse, nColumn);
    }
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    int regSortOut = ++pParse->nMem;
    iSortTab = pParse->nTab++;
    if( pSort->labelBkOut ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
    }
    sqlite3VdbeAddOp3(v, OP_OpenPseudo, iSortTab, regSortOut,
        nKey+1+nColumn+nRefKey);
    if( addrOnce ) sqlite3VdbeJumpHere(v, addrOnce);
    addr = 1 + sqlite3VdbeAddOp2(v, OP_SorterSort, iTab, addrBreak);
    VdbeCoverage(v);
    assert( p->iLimit==0 && p->iOffset==0 );
    sqlite3VdbeAddOp3(v, OP_SorterData, iTab, regSortOut, iSortTab);
    bSeq = 0;
  }else{
    addr = 1 + sqlite3VdbeAddOp2(v, OP_Sort, iTab, addrBreak); VdbeCoverage(v);
    codeOffset(v, p->iOffset, addrContinue);
    iSortTab = iTab;
    bSeq = 1;
    if( p->iOffset>0 ){
      sqlite3VdbeAddOp2(v, OP_AddImm, p->iLimit, -1);
    }
  }
  for(i=0, iCol=nKey+bSeq-1; i<nColumn; i++){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].fg.bSorterRef ) continue;
#endif
    if( aOutEx[i].u.x.iOrderByCol==0 ) iCol++;
  }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
  if( pSort->nDefer ){
    int iKey = iCol+1;
    int regKey = sqlite3GetTempRange(pParse, nRefKey);

    for(i=0; i<pSort->nDefer; i++){
      int iCsr = pSort->aDefer[i].iCsr;
      Table *pTab = pSort->aDefer[i].pTab;
      int nKey = pSort->aDefer[i].nKey;

      sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      if( HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey);
        sqlite3VdbeAddOp3(v, OP_SeekRowid, iCsr,
            sqlite3VdbeCurrentAddr(v)+1, regKey);
      }else{
        int k;
        int iJmp;
        assert( sqlite3PrimaryKeyIndex(pTab)->nKeyCol==nKey );
        for(k=0; k<nKey; k++){
          sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iKey++, regKey+k);
        }
        iJmp = sqlite3VdbeCurrentAddr(v);
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, iCsr, iJmp+2, regKey, nKey);
        sqlite3VdbeAddOp4Int(v, OP_IdxLE, iCsr, iJmp+3, regKey, nKey);
        sqlite3VdbeAddOp1(v, OP_NullRow, iCsr);
      }
    }
    sqlite3ReleaseTempRange(pParse, regKey, nRefKey);
  }
#endif
  for(i=nColumn-1; i>=0; i--){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( aOutEx[i].fg.bSorterRef ){
      sqlite3ExprCode(pParse, aOutEx[i].pExpr, regRow+i);
    }else
#endif
    {
      int iRead;
      if( aOutEx[i].u.x.iOrderByCol ){
        iRead = aOutEx[i].u.x.iOrderByCol-1;
      }else{
        iRead = iCol--;
      }
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, iRead, regRow+i);
      VdbeComment((v, "%s", aOutEx[i].zEName));
    }
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, addrExplain, -1);
  switch( eDest ){
    case SRT_Table:
    case SRT_EphemTab: {
      sqlite3VdbeAddOp3(v, OP_Column, iSortTab, nKey+bSeq, regRow);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iParm, regRow, regRowid);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case SRT_Set: {
      assert( nColumn==sqlite3Strlen30(pDest->zAffSdst) );
      sqlite3VdbeAddOp4(v, OP_MakeRecord, regRow, nColumn, regRowid,
                        pDest->zAffSdst, nColumn);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, regRowid, regRow, nColumn);
      break;
    }
    case SRT_Mem: {
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif
    case SRT_Upfrom: {
      int i2 = pDest->iSDParm2;
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord,regRow+(i2<0),nColumn-(i2<0),r1);
      if( i2<0 ){
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, regRow);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regRow, i2);
      }
      break;
    }
    default: {
      assert( eDest==SRT_Output || eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      testcase( eDest==SRT_Coroutine );
      if( eDest==SRT_Output ){
        sqlite3VdbeAddOp2(v, OP_ResultRow, pDest->iSdst, nColumn);
      }else{
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }
      break;
    }
  }
  if( regRowid ){
    if( eDest==SRT_Set ){
      sqlite3ReleaseTempRange(pParse, regRow, nColumn);
    }else{
      sqlite3ReleaseTempReg(pParse, regRow);
    }
    sqlite3ReleaseTempReg(pParse, regRowid);
  }
  /* The bottom of the loop
  */
  sqlite3VdbeResolveLabel(v, addrContinue);
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    sqlite3VdbeAddOp2(v, OP_SorterNext, iTab, addr); VdbeCoverage(v);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addr); VdbeCoverage(v);
  }
  sqlite3VdbeScanStatusRange(v, addrExplain, sqlite3VdbeCurrentAddr(v)-1, -1);
  if( pSort->regReturn ) sqlite3VdbeAddOp1(v, OP_Return, pSort->regReturn);
  sqlite3VdbeResolveLabel(v, addrBreak);
}